

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Descriptor *desc;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"private:\nvoid _slow_mutable_$name$();\n");
    desc = FieldDescriptor::message_type(this->descriptor_);
    bVar1 = SupportsArenas(desc);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "void _slow_set_allocated_$name$(\n    ::google::protobuf::Arena* message_arena, $type$** $name$);\n"
                        );
    }
    io::Printer::Print(printer,&this->variables_,"$type$* _slow_$release_name$();\npublic:\n");
  }
  (*(this->super_FieldGenerator)._vptr_FieldGenerator[0x18])(this,printer);
  if ((this->dependent_field_ & 1U) == 0) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$$type$* mutable_$name$();\n$deprecated_attr$$type$* $release_name$();\n$deprecated_attr$void set_allocated_$name$($type$* $name$);\n"
                      );
  }
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "$deprecated_attr$$type$* unsafe_arena_release_$name$();\n$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n    $type$* $name$);\n"
                      );
  }
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateAccessorDeclarations(io::Printer* printer) const {
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
       "private:\n"
       "void _slow_mutable_$name$();\n");
    if (SupportsArenas(descriptor_->message_type())) {
      printer->Print(variables_,
       "void _slow_set_allocated_$name$(\n"
       "    ::google::protobuf::Arena* message_arena, $type$** $name$);\n");
    }
    printer->Print(variables_,
       "$type$* _slow_$release_name$();\n"
       "public:\n");
  }
  GenerateGetterDeclaration(printer);
  if (!dependent_field_) {
    printer->Print(variables_,
      "$deprecated_attr$$type$* mutable_$name$();\n"
      "$deprecated_attr$$type$* $release_name$();\n"
      "$deprecated_attr$void set_allocated_$name$($type$* $name$);\n");
  }
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "$deprecated_attr$$type$* unsafe_arena_release_$name$();\n"
      "$deprecated_attr$void unsafe_arena_set_allocated_$name$(\n"
      "    $type$* $name$);\n");
  }
}